

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SqlGenerator.cpp
# Opt level: O2

void __thiscall SqlGenerator::generateJoinQuery(SqlGenerator *this)

{
  size_t sVar1;
  Attribute *pAVar2;
  size_t var;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_2e8;
  string attributeString;
  string joinString;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  ofstream ofs;
  
  std::__cxx11::string::string((string *)&joinString,"",(allocator *)&ofs);
  std::__cxx11::string::string((string *)&attributeString,"",(allocator *)&ofs);
  uVar3 = 0;
  while( true ) {
    sVar1 = TreeDecomposition::numberOfRelations
                      ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
    if (sVar1 <= uVar3) break;
    TreeDecomposition::getRelation
              ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               uVar3);
    std::__cxx11::string::append((string *)&joinString);
    sVar1 = TreeDecomposition::numberOfRelations
                      ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
    uVar3 = uVar3 + 1;
    if (uVar3 < sVar1) {
      std::__cxx11::string::append((char *)&joinString);
    }
  }
  uVar3 = 0;
  while( true ) {
    sVar1 = TreeDecomposition::numberOfAttributes
                      ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
    if (sVar1 <= uVar3) break;
    pAVar2 = TreeDecomposition::getAttribute
                       ((this->_td).
                        super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        uVar3);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ofs,
                   &pAVar2->_name,",");
    std::__cxx11::string::append((string *)&attributeString);
    std::__cxx11::string::~string((string *)&ofs);
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::pop_back();
  std::operator+(&bStack_2e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_,"/join.sql");
  std::ofstream::ofstream(&ofs,(string *)&bStack_2e8,_S_out);
  std::__cxx11::string::~string((string *)&bStack_2e8);
  std::operator+(&local_288,"CREATE TABLE joinres AS (SELECT ",&attributeString);
  std::operator+(&local_268,&local_288,"\nFROM ");
  std::operator+(&local_248,&local_268,&joinString);
  std::operator+(&bStack_2e8,&local_248,");\n");
  std::operator<<((ostream *)&ofs,(string *)&bStack_2e8);
  std::__cxx11::string::~string((string *)&bStack_2e8);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_288);
  std::ofstream::close();
  std::operator+(&bStack_2e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_,"/export.sql");
  std::ofstream::open((string *)&ofs,(_Ios_Openmode)&bStack_2e8);
  std::__cxx11::string::~string((string *)&bStack_2e8);
  std::operator<<((ostream *)&ofs,"\\COPY joinres TO \'joinresult.txt\' CSV DELIMITER \'|\';\n");
  std::ofstream::close();
  std::ofstream::~ofstream(&ofs);
  std::__cxx11::string::~string((string *)&attributeString);
  std::__cxx11::string::~string((string *)&joinString);
  return;
}

Assistant:

void SqlGenerator::generateJoinQuery()
{
    string joinString = "", attributeString  = "";
    
    for (size_t rel = 0; rel < _td->numberOfRelations(); ++rel)
    {    
        joinString += _td->getRelation(rel)->_name;
        if (rel + 1 < _td->numberOfRelations())
            joinString += " NATURAL JOIN ";
    }

    // TODO: This should only output the features not all variables.
    // If changed it should be changed in the Application load test data as well.
    for (size_t var = 0; var < _td->numberOfAttributes(); ++var)
        attributeString += _td->getAttribute(var)->_name + ",";
    attributeString.pop_back();

    std::ofstream ofs(multifaq::dir::OUTPUT_DIRECTORY+"/join.sql", std::ofstream::out);
    ofs << "CREATE TABLE joinres AS (SELECT "+attributeString+
        "\nFROM "+joinString+");\n";
    ofs.close();

    ofs.open(multifaq::dir::OUTPUT_DIRECTORY+"/export.sql", std::ofstream::out);
    ofs << "\\COPY joinres TO \'joinresult.txt\' CSV DELIMITER '|';\n";
    ofs.close();
}